

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O2

void __thiscall
QEGLPlatformContext::QEGLPlatformContext
          (QEGLPlatformContext *this,QSurfaceFormat *format,QPlatformOpenGLContext *share,
          EGLDisplay display,EGLConfig *config,Flags flags)

{
  QSurfaceFormat *this_00;
  EGLDisplay pvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  RenderableType RVar5;
  OpenGLContextProfile OVar6;
  uint uVar7;
  QSurfaceFormat *referenceFormat;
  QPlatformOpenGLContextPrivate *pQVar8;
  EGLContext pvVar9;
  QDebug *pQVar10;
  pointer ppvVar11;
  parameter_type t;
  EGLenum EVar12;
  EGLint i;
  ulong uVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<void_*> local_a8;
  EGLint numConfigs;
  QSurfaceFormat local_80;
  undefined1 local_78 [12];
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QArrayDataPointer<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformOpenGLContext::QPlatformOpenGLContext(&this->super_QPlatformOpenGLContext);
  (this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext =
       (_func_int **)&PTR__QEGLPlatformContext_0078b958;
  (this->super_QEGLContext)._vptr_QEGLContext = (_func_int **)&PTR__QEGLPlatformContext_0078ba10;
  this->m_eglDisplay = display;
  this_00 = &this->m_format;
  QSurfaceFormat::QSurfaceFormat(this_00);
  this->m_swapInterval = -1;
  this->m_swapIntervalEnvChecked = false;
  this->m_swapIntervalFromEnv = -1;
  (this->m_flags).super_QFlagsStorageHelper<QEGLPlatformContext::Flag,_4>.
  super_QFlagsStorage<QEGLPlatformContext::Flag>.i =
       (Int)flags.super_QFlagsStorageHelper<QEGLPlatformContext::Flag,_4>.
            super_QFlagsStorage<QEGLPlatformContext::Flag>.i;
  this->m_ownsContext = true;
  (this->m_contextAttrs).d.d = (Data *)0x0;
  (this->m_contextAttrs).d.ptr = (int *)0x0;
  *(undefined8 *)((long)&(this->m_contextAttrs).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_contextAttrs).d.size + 1) = 0;
  if (config == (EGLConfig *)0x0) {
    referenceFormat = (QSurfaceFormat *)q_configFromGLFormat(display,format,false,4);
  }
  else {
    referenceFormat = (QSurfaceFormat *)*config;
  }
  this->m_eglConfig = referenceFormat;
  q_glFormatFromConfig((QSurfaceFormat *)local_78,this->m_eglDisplay,referenceFormat);
  QSurfaceFormat::operator=(this_00,(QSurfaceFormat *)local_78);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_78);
  if (share == (QPlatformOpenGLContext *)0x0) {
    pQVar8 = (QPlatformOpenGLContextPrivate *)0x0;
  }
  else {
    pQVar8 = share[1].d_ptr.d;
  }
  this->m_shareContext = pQVar8;
  local_58.d = (Data *)0x0;
  local_58.ptr = (int *)0x0;
  local_58.size = 0;
  QList<int>::append((QList<int> *)&local_58,0x3098);
  iVar4 = QSurfaceFormat::majorVersion(format);
  QList<int>::append((QList<int> *)&local_58,iVar4);
  bVar2 = q_hasEglExtension(this->m_eglDisplay,"EGL_KHR_create_context");
  if (!bVar2) goto LAB_005675db;
  QList<int>::append((QList<int> *)&local_58,0x30fb);
  iVar4 = QSurfaceFormat::minorVersion(format);
  QList<int>::append((QList<int> *)&local_58,iVar4);
  bVar2 = QSurfaceFormat::testOption(format,DebugContext);
  RVar5 = QSurfaceFormat::renderableType(this_00);
  if ((RVar5 == OpenGL) && (iVar4 = QSurfaceFormat::majorVersion(format), 2 < iVar4)) {
    bVar3 = QSurfaceFormat::testOption(format,DeprecatedFunctions);
    t = 1;
    if (!bVar3) {
      t = bVar2 + 2;
    }
    if (bVar2 || !bVar3) {
LAB_0056757a:
      QList<int>::append((QList<int> *)&local_58,0x30fc);
      QList<int>::append((QList<int> *)&local_58,t);
    }
  }
  else if (bVar2) {
    t = 1;
    goto LAB_0056757a;
  }
  RVar5 = QSurfaceFormat::renderableType(this_00);
  if (RVar5 == OpenGL) {
    QList<int>::append((QList<int> *)&local_58,0x30fd);
    OVar6 = QSurfaceFormat::profile(format);
    QList<int>::append((QList<int> *)&local_58,(OVar6 != CoreProfile) + 1);
  }
LAB_005675db:
  bVar2 = QSurfaceFormat::testOption(format,ProtectedContent);
  if (bVar2) {
    bVar2 = q_hasEglExtension(this->m_eglDisplay,"EGL_EXT_protected_content");
    if (bVar2) {
      QList<int>::append((QList<int> *)&local_58,0x32c0);
      QList<int>::append((QList<int> *)&local_58,1);
    }
    else {
      QSurfaceFormat::setOption(this_00,ProtectedContent,false);
    }
  }
  RVar5 = QSurfaceFormat::renderableType(this_00);
  if (RVar5 == OpenVG) {
    QList<int>::append((QList<int> *)&local_58,0x303e);
    QList<int>::append((QList<int> *)&local_58,8);
  }
  QList<int>::append((QList<int> *)&local_58,0x3038);
  QArrayDataPointer<int>::operator=(&(this->m_contextAttrs).d,&local_58);
  RVar5 = QSurfaceFormat::renderableType(this_00);
  EVar12 = 0x30a1;
  if (RVar5 != OpenVG) {
    EVar12 = (uint)(RVar5 == OpenGL) * 2 + 0x30a0;
  }
  this->m_api = EVar12;
  eglBindAPI();
  pvVar9 = (EGLContext)
           eglCreateContext(this->m_eglDisplay,this->m_eglConfig,this->m_shareContext,local_58.ptr);
  this->m_eglContext = pvVar9;
  if ((pvVar9 == (EGLContext)0x0) && (this->m_shareContext != (EGLContext)0x0)) {
    this->m_shareContext = (EGLContext)0x0;
    pvVar9 = (EGLContext)eglCreateContext(this->m_eglDisplay,this->m_eglConfig,0,local_58.ptr);
    this->m_eglContext = pvVar9;
  }
  if (pvVar9 == (EGLContext)0x0) {
    local_78._0_4_ = 2;
    local_64 = 0;
    local_78._4_8_ = 0;
    uStack_6c = 0;
    local_60 = "default";
    uVar7 = eglGetError();
    QMessageLogger::warning
              (local_78,"QEGLPlatformContext: Failed to create context: %x",(ulong)uVar7);
  }
  else {
    if ((QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
         ::printConfig == '\0') &&
       (iVar4 = __cxa_guard_acquire(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                                     ::printConfig), iVar4 != 0)) {
      iVar4 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG",(bool *)0x0);
      QEGLPlatformContext::printConfig = iVar4 != 0;
      __cxa_guard_release(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                           ::printConfig);
    }
    if (QEGLPlatformContext::printConfig == true) {
      local_78._0_4_ = 2;
      local_64 = 0;
      local_78._4_8_ = 0;
      uStack_6c = 0;
      local_60 = "default";
      QMessageLogger::debug();
      pQVar10 = QDebug::operator<<((QDebug *)&numConfigs,"Created context for format");
      local_80.d = (QSurfaceFormatPrivate *)pQVar10->stream;
      ((Stream *)local_80.d)->ref = ((Stream *)local_80.d)->ref + 1;
      ::operator<<((Stream *)&local_a8,&local_80);
      QDebug::operator<<((QDebug *)&local_a8,"with config:");
      QDebug::~QDebug((QDebug *)&local_a8);
      QDebug::~QDebug((QDebug *)&local_80);
      QDebug::~QDebug((QDebug *)&numConfigs);
      q_printEglConfig(this->m_eglDisplay,this->m_eglConfig);
      if ((QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
           ::printAllConfigs == '\0') &&
         (iVar4 = __cxa_guard_acquire(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                                       ::printAllConfigs), iVar4 != 0)) {
        iVar4 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG",(bool *)0x0);
        QEGLPlatformContext::printAllConfigs = 1 < iVar4;
        __cxa_guard_release(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                             ::printAllConfigs);
      }
      if (QEGLPlatformContext::printAllConfigs == true) {
        numConfigs = 0;
        eglGetConfigs(this->m_eglDisplay,0,0,&numConfigs);
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (void **)0x0;
        local_a8.size = 0;
        QList<void_*>::resize((QList<void_*> *)&local_a8,(long)numConfigs);
        pvVar1 = this->m_eglDisplay;
        ppvVar11 = QList<void_*>::data((QList<void_*> *)&local_a8);
        eglGetConfigs(pvVar1,ppvVar11,numConfigs,&numConfigs);
        local_78._0_4_ = 2;
        local_64 = 0;
        local_78._4_8_ = 0;
        uStack_6c = 0;
        local_60 = "default";
        QMessageLogger::debug(local_78,"\nAll EGLConfigs: count=%d",(ulong)(uint)numConfigs);
        for (uVar13 = 0; (long)uVar13 < (long)numConfigs; uVar13 = uVar13 + 1) {
          local_78._0_4_ = 2;
          local_78._4_8_ = 0;
          uStack_6c = 0;
          local_64 = 0;
          local_60 = "default";
          QMessageLogger::debug(local_78,"EGLConfig #%d",uVar13 & 0xffffffff);
          pvVar1 = this->m_eglDisplay;
          ppvVar11 = QList<void_*>::data((QList<void_*> *)&local_a8);
          q_printEglConfig(pvVar1,ppvVar11[uVar13]);
        }
        local_78._0_4_ = 2;
        local_78._4_8_ = 0;
        uStack_6c = 0;
        local_64 = 0;
        local_60 = "default";
        QMessageLogger::debug(local_78,"\n");
        QArrayDataPointer<void_*>::~QArrayDataPointer(&local_a8);
      }
    }
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QEGLPlatformContext::QEGLPlatformContext(const QSurfaceFormat &format, QPlatformOpenGLContext *share, EGLDisplay display,
                                         EGLConfig *config, Flags flags)
    : m_eglDisplay(display)
    , m_flags(flags)
    , m_ownsContext(true)
{
    m_eglConfig = config ? *config : q_configFromGLFormat(display, format);

    m_format = q_glFormatFromConfig(m_eglDisplay, m_eglConfig, format);
    // m_format now has the renderableType() resolved (it cannot be Default anymore)
    // but does not yet contain version, profile, options.
    m_shareContext = share ? static_cast<QEGLPlatformContext *>(share)->m_eglContext : nullptr;

    QList<EGLint> contextAttrs;
    contextAttrs.append(EGL_CONTEXT_CLIENT_VERSION);
    contextAttrs.append(format.majorVersion());
    const bool hasKHRCreateContext = q_hasEglExtension(m_eglDisplay, "EGL_KHR_create_context");
    if (hasKHRCreateContext) {
        contextAttrs.append(EGL_CONTEXT_MINOR_VERSION_KHR);
        contextAttrs.append(format.minorVersion());
        int flags = 0;
        // The debug bit is supported both for OpenGL and OpenGL ES.
        if (format.testOption(QSurfaceFormat::DebugContext))
            flags |= EGL_CONTEXT_OPENGL_DEBUG_BIT_KHR;
        // The fwdcompat bit is only for OpenGL 3.0+.
        if (m_format.renderableType() == QSurfaceFormat::OpenGL
            && format.majorVersion() >= 3
            && !format.testOption(QSurfaceFormat::DeprecatedFunctions))
            flags |= EGL_CONTEXT_OPENGL_FORWARD_COMPATIBLE_BIT_KHR;
        if (flags) {
            contextAttrs.append(EGL_CONTEXT_FLAGS_KHR);
            contextAttrs.append(flags);
        }
        // Profiles are OpenGL only and mandatory in 3.2+. The value is silently ignored for < 3.2.
        if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
            contextAttrs.append(EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR);
            contextAttrs.append(format.profile() == QSurfaceFormat::CoreProfile
                                ? EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR
                                : EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR);
        }
    }

#ifdef EGL_EXT_protected_content
    if (format.testOption(QSurfaceFormat::ProtectedContent)) {
        if (q_hasEglExtension(m_eglDisplay, "EGL_EXT_protected_content")) {
            contextAttrs.append(EGL_PROTECTED_CONTENT_EXT);
            contextAttrs.append(EGL_TRUE);
        } else {
            m_format.setOption(QSurfaceFormat::ProtectedContent, false);
        }
    }
#endif

    // Special Options for OpenVG surfaces
    if (m_format.renderableType() == QSurfaceFormat::OpenVG) {
        contextAttrs.append(EGL_ALPHA_MASK_SIZE);
        contextAttrs.append(8);
    }

    contextAttrs.append(EGL_NONE);
    m_contextAttrs = contextAttrs;

    switch (m_format.renderableType()) {
    case QSurfaceFormat::OpenVG:
        m_api = EGL_OPENVG_API;
        break;
#ifdef EGL_VERSION_1_4
    case QSurfaceFormat::OpenGL:
        m_api = EGL_OPENGL_API;
        break;
#endif // EGL_VERSION_1_4
    default:
        m_api = EGL_OPENGL_ES_API;
        break;
    }

    eglBindAPI(m_api);
    m_eglContext = eglCreateContext(m_eglDisplay, m_eglConfig, m_shareContext, contextAttrs.constData());
    if (m_eglContext == EGL_NO_CONTEXT && m_shareContext != EGL_NO_CONTEXT) {
        m_shareContext = nullptr;
        m_eglContext = eglCreateContext(m_eglDisplay, m_eglConfig, nullptr, contextAttrs.constData());
    }

    if (m_eglContext == EGL_NO_CONTEXT) {
        qWarning("QEGLPlatformContext: Failed to create context: %x", eglGetError());
        return;
    }

    static const bool printConfig = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG");
    if (printConfig) {
        qDebug() << "Created context for format" << format << "with config:";
        q_printEglConfig(m_eglDisplay, m_eglConfig);

        static const bool printAllConfigs = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG") > 1;
        if (printAllConfigs) {
            EGLint numConfigs = 0;
            eglGetConfigs(m_eglDisplay, nullptr, 0, &numConfigs);
            QVector<EGLConfig> configs;
            configs.resize(numConfigs);
            eglGetConfigs(m_eglDisplay, configs.data(), numConfigs, &numConfigs);
            qDebug("\nAll EGLConfigs: count=%d", numConfigs);
            for (EGLint i = 0; i < numConfigs; ++i) {
                qDebug("EGLConfig #%d", i);
                q_printEglConfig(m_eglDisplay, configs[i]);
            }
            qDebug("\n");
        }
    }

    // Cannot just call updateFormatFromGL() since it relies on virtuals. Defer it to initialize().
}